

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O0

string * __thiscall
cmsys::RegularExpressionMatch::match_abi_cxx11_
          (string *__return_storage_ptr__,RegularExpressionMatch *this,int n)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_1d;
  int local_1c;
  RegularExpressionMatch *pRStack_18;
  int n_local;
  RegularExpressionMatch *this_local;
  
  local_1c = n;
  pRStack_18 = this;
  this_local = (RegularExpressionMatch *)__return_storage_ptr__;
  if (this->startp[n] == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pcVar1 = this->startp[n];
    pcVar2 = this->endp[n];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar1,(long)pcVar2 - (long)pcVar1,&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string RegularExpressionMatch::match(int n) const
{
  if (this->startp[n] == 0) {
    return std::string();
  } else {
    return std::string(
      this->startp[n],
      static_cast<std::string::size_type>(this->endp[n] - this->startp[n]));
  }
}